

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

void __thiscall
EncoderVelocity::SetData
          (EncoderVelocity *this,uint32_t rawPeriod,uint32_t rawQtr1,uint32_t rawQtr5,
          uint32_t rawRun,bool isESPM)

{
  double local_30;
  bool isESPM_local;
  uint32_t rawRun_local;
  uint32_t rawQtr5_local;
  uint32_t rawQtr1_local;
  uint32_t rawPeriod_local;
  EncoderVelocity *this_local;
  
  Init(this);
  local_30 = 1.25e-08;
  if (!isESPM) {
    local_30 = 2.0345052083333333e-08;
  }
  this->clkPeriod = local_30;
  this->velPeriodMax = 0x3ffffff;
  this->qtrPeriodMax = 0x3ffffff;
  this->velPeriod = rawPeriod & 0x3ffffff;
  this->velOverflow = (rawPeriod & 0x80000000) != 0;
  this->velDir = (rawPeriod & 0x40000000) != 0;
  this->dirChange = (rawPeriod & 0x20000000) != 0;
  this->encError = (rawPeriod & 0x10000000) != 0;
  this->partialCycle = (rawPeriod & 0x8000000) != 0;
  this->qtr1Period = rawQtr1 & 0x3ffffff;
  this->qtr1Overflow = (rawQtr1 & 0x80000000) != 0;
  this->qtr1Dir = (rawQtr1 & 0x40000000) != 0;
  this->qtr1Edges = (byte)(rawQtr1 >> 0x1a) & 0xf;
  this->qtr5Period = rawQtr5 & 0x3ffffff;
  this->qtr5Overflow = (rawQtr5 & 0x80000000) != 0;
  this->qtr5Dir = (rawQtr5 & 0x40000000) != 0;
  this->qtr5Edges = (byte)(rawQtr5 >> 0x1a) & 0xf;
  this->runPeriod = rawRun & 0x3ffffff;
  this->runOverflow = (rawRun & 0x80000000) != 0;
  return;
}

Assistant:

void EncoderVelocity::SetData(uint32_t rawPeriod, uint32_t rawQtr1, uint32_t rawQtr5, uint32_t rawRun,
                              bool isESPM)
{
    Init();
    clkPeriod = isESPM ? VEL_PERD_ESPM : VEL_PERD;
    velPeriodMax = ENC_VEL_MASK_26;
    qtrPeriodMax = ENC_VEL_QTR_MASK;  // 26 bits
    velPeriod = rawPeriod & ENC_VEL_MASK_26;
    velOverflow = rawPeriod & ENC_VEL_OVER_MASK;
    velDir = rawPeriod & ENC_DIR_MASK;
    dirChange = rawPeriod & 0x20000000;
    encError = rawPeriod & 0x10000000;
    partialCycle = rawPeriod & 0x08000000;
    qtr1Period = rawQtr1 & ENC_VEL_QTR_MASK;
    qtr1Overflow = rawQtr1 & ENC_VEL_OVER_MASK;
    qtr1Dir = rawQtr1 & ENC_DIR_MASK;
    qtr1Edges = (rawQtr1>>26)&0x0f;
    qtr5Period = rawQtr5 & ENC_VEL_QTR_MASK;
    qtr5Overflow = rawQtr5 & ENC_VEL_OVER_MASK;
    qtr5Dir = rawQtr5 & ENC_DIR_MASK;
    qtr5Edges = (rawQtr5>>26)&0x0f;
    runPeriod = rawRun & ENC_VEL_QTR_MASK;
    runOverflow = rawRun & ENC_VEL_OVER_MASK;
}